

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zeCommandListAppendLaunchKernelIndirect
          (ze_command_list_handle_t hCommandList,ze_kernel_handle_t hKernel,
          ze_group_count_t *pLaunchArgumentsBuffer,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ze_result_t zVar4;
  void *pvVar5;
  ulong uVar6;
  undefined8 local_48;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x2d0);
  if (pcVar1 == (code *)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (hSignalEvent == (ze_event_handle_t)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *(undefined8 *)hSignalEvent;
    }
    uVar2 = *(undefined8 *)hCommandList;
    uVar3 = *(undefined8 *)hKernel;
    pvVar5 = operator_new__((ulong)numWaitEvents * 8);
    if (numWaitEvents != 0 && phWaitEvents != (ze_event_handle_t *)0x0) {
      uVar6 = 0;
      do {
        *(undefined8 *)((long)pvVar5 + uVar6 * 8) = *(undefined8 *)phWaitEvents[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar6 < numWaitEvents);
    }
    zVar4 = (*pcVar1)(uVar2,uVar3,pLaunchArgumentsBuffer,local_48,numWaitEvents,pvVar5);
    operator_delete__(pvVar5);
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendLaunchKernelIndirect(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        const ze_group_count_t* pLaunchArgumentsBuffer, ///< [in] pointer to device buffer that will contain thread group launch
                                                        ///< arguments
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendLaunchKernelIndirect = dditable->ze.CommandList.pfnAppendLaunchKernelIndirect;
        if( nullptr == pfnAppendLaunchKernelIndirect )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // convert loader handles to driver handles
        auto phWaitEventsLocal = new ze_event_handle_t [numWaitEvents];
        for( size_t i = 0; ( nullptr != phWaitEvents ) && ( i < numWaitEvents ); ++i )
            phWaitEventsLocal[ i ] = reinterpret_cast<ze_event_object_t*>( phWaitEvents[ i ] )->handle;

        // forward to device-driver
        result = pfnAppendLaunchKernelIndirect( hCommandList, hKernel, pLaunchArgumentsBuffer, hSignalEvent, numWaitEvents, phWaitEventsLocal );
        delete []phWaitEventsLocal;

        return result;
    }